

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

int __thiscall stream::slice_reader::open(slice_reader *this,char *__file,int __oflag,...)

{
  path_type *lhs;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  slice_error *this_00;
  path_type slice_file2;
  path_type slice_file;
  string local_1b8;
  ostringstream oss;
  
  this->current_slice = (size_t)__file;
  this->is = (istream *)&this->ifs;
  std::ifstream::close();
  slice_filename((string *)&oss,&this->base_file,(size_t)__file,this->slices_per_disk);
  std::__cxx11::string::string((string *)&slice_file,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  lhs = &this->dir;
  boost::filesystem::operator/((path *)&oss,lhs,&slice_file);
  bVar1 = open_file(this,(path_type *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if (bVar1) goto LAB_00145a59;
  slice_filename((string *)&oss,&this->base_file2,(size_t)__file,this->slices_per_disk);
  std::__cxx11::string::string((string *)&slice_file2,(string *)&oss);
  std::__cxx11::string::~string((string *)&oss);
  if ((this->base_file2)._M_string_length == 0) {
LAB_00145a13:
    bVar1 = open_file_case_insensitive(this,lhs,&slice_file);
    if (!bVar1) {
      if ((this->base_file2)._M_string_length == 0) {
LAB_00145a71:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar3 = std::operator<<((ostream *)&oss,"could not open slice ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,": ");
        boost::filesystem::operator<<(poVar3,&slice_file);
        if ((this->base_file2)._M_string_length != 0) {
          bVar1 = boost::filesystem::operator!=(&slice_file2,&slice_file);
          if (bVar1) {
            poVar3 = std::operator<<((ostream *)&oss," or ");
            boost::filesystem::operator<<(poVar3,&slice_file2);
          }
        }
        this_00 = (slice_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        slice_error::slice_error(this_00,&local_1b8);
        __cxa_throw(this_00,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      bVar1 = boost::filesystem::operator!=(&slice_file2,&slice_file);
      if (!bVar1) goto LAB_00145a71;
      bVar1 = open_file_case_insensitive(this,lhs,&slice_file2);
      if (!bVar1) goto LAB_00145a71;
    }
  }
  else {
    bVar1 = boost::filesystem::operator!=(&slice_file2,&slice_file);
    if (!bVar1) goto LAB_00145a13;
    boost::filesystem::operator/((path *)&oss,lhs,&slice_file2);
    bVar1 = open_file(this,(path_type *)&oss);
    std::__cxx11::string::~string((string *)&oss);
    if (!bVar1) goto LAB_00145a13;
  }
  std::__cxx11::string::~string((string *)&slice_file2);
LAB_00145a59:
  iVar2 = std::__cxx11::string::~string((string *)&slice_file);
  return iVar2;
}

Assistant:

void slice_reader::open(size_t slice) {
	
	current_slice = slice;
	is = &ifs;
	ifs.close();
	
	path_type slice_file = slice_filename(base_file, slice, slices_per_disk);
	if(open_file(dir / slice_file)) {
		return;
	}
	
	path_type slice_file2 = slice_filename(base_file2, slice, slices_per_disk);
	if(!base_file2.empty() && slice_file2 != slice_file && open_file(dir / slice_file2)) {
		return;
	}
	
	if(open_file_case_insensitive(dir, slice_file)) {
		return;
	}
	
	if(!base_file2.empty() && slice_file2 != slice_file && open_file_case_insensitive(dir, slice_file2)) {
		return;
	}
	
	std::ostringstream oss;
	oss << "could not open slice " << slice << ": " << slice_file;
	if(!base_file2.empty() && slice_file2 != slice_file) {
		oss << " or " << slice_file2;
	}
	throw slice_error(oss.str());
}